

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_comment.cpp
# Opt level: O2

void __thiscall
Comment_MultiLineRowCounting_Test::Comment_MultiLineRowCounting_Test
          (Comment_MultiLineRowCounting_Test *this)

{
  anon_unknown.dwarf_72b2c::Comment::Comment(&this->super_Comment);
  (this->super_Comment).super_Test._vptr_Test = (_func_int **)&PTR__Comment_001aa4c8;
  return;
}

Assistant:

TEST_F (Comment, MultiLineRowCounting) {
    using testing::_;
    EXPECT_CALL (callbacks_, begin_array ()).Times (1);
    EXPECT_CALL (callbacks_, uint64_value (_)).Times (2);
    EXPECT_CALL (callbacks_, end_array ()).Times (1);

    json::parser<decltype (proxy_)> p =
        json::make_parser (proxy_, json::extensions::multi_line_comments);
    p.input (R"([ /*comment */
1, /* comment
comment
*/
2 /* comment */
]
/* comment
comment */
)"s)
        .eof ();
    EXPECT_FALSE (p.has_error ()) << "JSON error was: " << p.last_error ().message ();
    EXPECT_EQ (p.coordinate (), (json::coord{1, 9}));
}